

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

void init_top(mstate m,mchunkptr p,size_t psize)

{
  ulong uVar1;
  
  uVar1 = (ulong)(-(int)m - 0x10U & 0xf);
  _gm_.top = (mchunkptr)((long)m->smallbins + (uVar1 - 0x48));
  _gm_.topsize = (long)p - uVar1;
  *(size_t *)((long)m->smallbins + (uVar1 - 0x40)) = _gm_.topsize | 1;
  *(undefined8 *)((long)&m->dvsize + (long)p) = 0x50;
  _gm_.trim_check = mparams.trim_threshold;
  return;
}

Assistant:

static void init_top(mstate m, mchunkptr p, size_t psize) {
  /* Ensure alignment */
  size_t offset = align_offset(chunk2mem(p));
  p = (mchunkptr)((char*)p + offset);
  psize -= offset;

  m->top = p;
  m->topsize = psize;
  p->head = psize | PINUSE_BIT;
  /* set size of fake trailing chunk holding overhead space only once */
  chunk_plus_offset(p, psize)->head = TOP_FOOT_SIZE;
  m->trim_check = mparams.trim_threshold; /* reset on each update */
}